

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::FileIsFIFO(string *name)

{
  int iVar1;
  char *__file;
  undefined1 local_a8 [8];
  stat fs;
  string *name_local;
  
  fs.__glibc_reserved[2] = (__syscall_slong_t)name;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = lstat(__file,(stat *)local_a8);
  name_local._7_1_ = iVar1 == 0 && ((uint)fs.st_nlink & 0xf000) == 0x1000;
  return name_local._7_1_;
}

Assistant:

bool SystemTools::FileIsFIFO(const std::string& name)
{
#if defined(_WIN32)
  HANDLE hFile =
    CreateFileW(Encoding::ToWide(name).c_str(), GENERIC_READ, FILE_SHARE_READ,
                nullptr, OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, nullptr);
  if (hFile == INVALID_HANDLE_VALUE) {
    return false;
  }
  const DWORD type = GetFileType(hFile);
  CloseHandle(hFile);
  return type == FILE_TYPE_PIPE;
#else
  struct stat fs;
  if (lstat(name.c_str(), &fs) == 0) {
    return S_ISFIFO(fs.st_mode);
  } else {
    return false;
  }
#endif
}